

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O3

void __thiscall
SAT::explainUnlearnable(SAT *this,set<int,_std::less<int>,_std::allocator<int>_> *param_1)

{
  Reason *pRVar1;
  Reason RVar2;
  Clause *pCVar3;
  Lit *pLVar4;
  char *pcVar5;
  vec<Lit> *this_00;
  long lVar6;
  anon_union_8_2_743a5d44_for_Reason_0 aVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  Lit q;
  Lit p;
  Lit local_64;
  int local_60;
  Lit local_5c;
  vec<Lit> local_58;
  long local_40;
  vec<Lit> *local_38;
  undefined4 extraout_var;
  
  lVar6 = std::chrono::_V2::steady_clock::now();
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (Lit *)0x0;
  uVar9 = (this->out_learnt).sz;
  if (1 < uVar9) {
    local_38 = &this->out_learnt;
    uVar12 = 1;
    local_40 = lVar6;
    do {
      uVar10 = (this->out_learnt).data[uVar12].x;
      uVar14 = (int)uVar10 >> 1;
      local_5c.x = uVar10;
      if (((uint)(this->flags).data[uVar14] & 4) == 0) {
        pRVar1 = (this->reason).data;
        aVar7 = (anon_union_8_2_743a5d44_for_Reason_0)pRVar1[uVar14].field_0._pt;
        uVar9 = aVar7._0_4_ & 3;
        if ((aVar7._a & 3) != 0) {
          if (uVar9 == 1) {
            btToPos(this,this->index,(this->trailpos).data[uVar14]);
            RVar2.field_0 =
                 (anon_union_8_2_743a5d44_for_Reason_0)(this->reason).data[uVar14].field_0._a;
            aVar7._0_4_ = (*engine.propagators.data[(ulong)RVar2.field_0 >> 0x20]->_vptr_Propagator
                            [5])(engine.propagators.data[(ulong)RVar2.field_0 >> 0x20],
                                 (ulong)(uVar10 ^ 1),(ulong)RVar2.field_0 >> 2 & 0x3fffffff);
            aVar7._a._4_4_ = extraout_var;
          }
          else {
            pCVar3 = this->short_expl;
            *(uint *)pCVar3 = uVar9 << 8 | (uint)*(byte *)pCVar3;
            *(uint *)(pCVar3 + 1) = *(uint *)&pRVar1[uVar14].field_0 >> 2;
            if (uVar9 == 3) {
              pCVar3[1].data[0].x = *(int *)((long)&pRVar1[uVar14].field_0 + 4);
            }
            aVar7 = (anon_union_8_2_743a5d44_for_Reason_0)this->short_expl;
          }
        }
        vec<Lit>::push(&local_58,&local_5c);
        this_00 = local_38;
        pLVar4 = (this->out_learnt).data;
        pLVar4[uVar12].x = pLVar4[(this->out_learnt).sz - 1].x;
        uVar9 = (this->out_learnt).sz - 1;
        (this->out_learnt).sz = uVar9;
        (this->out_learnt_level).sz = (this->out_learnt_level).sz - 1;
        uVar10 = *(uint *)aVar7._pt;
        if (0x1ff < uVar10) {
          uVar15 = 1;
          do {
            if (uVar10 >> 8 <= uVar15) {
              abort();
            }
            local_64.x = (aVar7._pt)->data[uVar15].x;
            pcVar5 = (this->seen).data;
            if (pcVar5[(uint)(local_64.x >> 1)] == '\0') {
              pcVar5[(uint)(local_64.x >> 1)] = '\x01';
              vec<Lit>::push(this_00,&local_64);
              uVar13 = (ulong)engine.trail_lim.sz;
              iVar11 = engine.trail_lim.sz + 1;
              do {
                bVar16 = uVar13 == 0;
                uVar13 = uVar13 - 1;
                if (bVar16) {
                  iVar11 = 0;
                  break;
                }
                iVar11 = iVar11 + -1;
              } while ((this->trailpos).data[(uint)(local_64.x >> 1)] <
                       engine.trail_lim.data[uVar13]);
              local_60 = iVar11 + -1;
              if (iVar11 == 0) {
                local_60 = 0;
              }
              vec<int>::push(&this->out_learnt_level,&local_60);
            }
            uVar15 = uVar15 + 1;
            uVar10 = *(uint *)aVar7._pt;
          } while (uVar15 < uVar10 >> 8);
          uVar9 = this_00->sz;
        }
      }
      else {
        uVar12 = uVar12 + 1;
      }
    } while (uVar12 < uVar9);
    lVar6 = local_40;
    if (local_58.sz != 0) {
      uVar15 = 0;
      do {
        (this->seen).data[(uint)(local_58.data[uVar15].x >> 1)] = '\0';
        uVar15 = uVar15 + 1;
      } while (uVar15 < (local_58._0_8_ & 0xffffffff));
    }
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  (this->pushback_time).__r = (this->pushback_time).__r + (lVar8 - lVar6) / 1000000;
  if (local_58.data != (Lit *)0x0) {
    free(local_58.data);
  }
  return;
}

Assistant:

void SAT::explainUnlearnable(std::set<int>& /*contributingNogoods*/) {
	const time_point start = chuffed_clock::now();

	vec<Lit> removed;
	for (unsigned int i = 1; i < out_learnt.size(); i++) {
		const Lit p = out_learnt[i];
		if (flags[var(p)].learnable()) {
			continue;
		}
		assert(!reason[var(p)].isLazy());
		Clause& c = *getExpl(~p);
		removed.push(p);
		out_learnt[i] = out_learnt.last();
		out_learnt.pop();
		out_learnt_level.pop();
		i--;
		for (unsigned int j = 1; j < c.size(); j++) {
			const Lit q = c[j];
			if (seen[var(q)] == 0) {
				seen[var(q)] = 1;
				out_learnt.push(q);
				out_learnt_level.push(getLevel(var(q)));
			}
		}
	}

	for (unsigned int i = 0; i < removed.size(); i++) {
		seen[var(removed[i])] = 0;
	}

	pushback_time += std::chrono::duration_cast<duration>(chuffed_clock::now() - start);
}